

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * ParseDocTypeDecl(TidyDocImpl *doc)

{
  Lexer *lexer_00;
  Bool BVar1;
  uint uVar2;
  int iVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  Node *node_00;
  char *name;
  bool bVar6;
  Bool local_6c;
  Node *subset;
  AttVal *att;
  char *value;
  char *attname;
  AttVal *si;
  Node *node;
  Bool local_30;
  Bool hasfpi;
  uint delim;
  uint c;
  ParseDocTypeDeclState state;
  int start;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  c = lexer_00->lexsize;
  delim = 1;
  local_30 = no;
  bVar6 = true;
  doc_local = (TidyDocImpl *)prvTidyNewNode(lexer_00->allocator,lexer_00);
  (doc_local->root).type = DocTypeTag;
  (doc_local->root).start = lexer_00->txtstart;
  (doc_local->root).end = lexer_00->txtend;
  lexer_00->waswhite = no;
switchD_00157d63_default:
  local_6c = prvTidyReadChar(doc->docIn);
  if (local_6c == ~no) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x253);
    prvTidyFreeNode(doc,(Node *)doc_local);
    return (Node *)0x0;
  }
  hasfpi = local_6c;
  if (delim != 4) {
    if (local_6c == 10) {
      local_6c = 0x20;
    }
    hasfpi = local_6c;
  }
  BVar1 = prvTidyIsWhite(hasfpi);
  if ((BVar1 == no) || (delim == 4)) {
    prvTidyAddCharToLexer(lexer_00,hasfpi);
    lexer_00->waswhite = no;
  }
  else {
    if (lexer_00->waswhite != no) goto switchD_00157d63_default;
    prvTidyAddCharToLexer(lexer_00,hasfpi);
    lexer_00->waswhite = yes;
  }
  switch(delim) {
  case 0:
    uVar2 = prvTidyToUpper(hasfpi);
    if ((uVar2 == 0x50) || (uVar2 = prvTidyToUpper(hasfpi), uVar2 == 0x53)) {
      c = lexer_00->lexsize - 1;
      delim = 2;
    }
    else if (hasfpi == 0x5b) {
      c = lexer_00->lexsize;
      delim = 4;
    }
    else if ((hasfpi == 0x27) || (hasfpi == 0x22)) {
      c = lexer_00->lexsize;
      local_30 = hasfpi;
      delim = 3;
    }
    else if (hasfpi == 0x3e) {
      uVar2 = lexer_00->lexsize - 1;
      lexer_00->lexsize = uVar2;
      (doc_local->root).end = uVar2;
      pAVar5 = prvTidyGetAttrByName((Node *)doc_local,"SYSTEM");
      if (pAVar5 != (AttVal *)0x0) {
        prvTidyCheckUrl(doc,(Node *)doc_local,pAVar5);
      }
      if (((doc_local->root).element == (tmbstr)0x0) ||
         (BVar1 = prvTidyIsValidXMLID((doc_local->root).element), BVar1 == no)) {
        prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x253);
        prvTidyFreeNode(doc,(Node *)doc_local);
        doc_local = (TidyDocImpl *)0x0;
      }
      return &doc_local->root;
    }
    break;
  case 1:
    BVar1 = prvTidyIsWhite(hasfpi);
    if (((BVar1 != no) || (hasfpi == 0x3e)) || (hasfpi == 0x5b)) {
      ptVar4 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)c,
                                 (lexer_00->lexsize - c) - 1);
      (doc_local->root).element = ptVar4;
      if ((hasfpi == 0x3e) || (hasfpi == 0x5b)) {
        lexer_00->lexsize = lexer_00->lexsize - 1;
        prvTidyUngetChar(hasfpi,doc->docIn);
      }
      delim = 0;
    }
    break;
  case 2:
    BVar1 = prvTidyIsWhite(hasfpi);
    if ((BVar1 != no) || (hasfpi == 0x3e)) {
      ptVar4 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)c,
                                 (lexer_00->lexsize - c) - 1);
      iVar3 = prvTidytmbstrcasecmp(ptVar4,"SYSTEM");
      bVar6 = iVar3 != 0;
      (*doc->allocator->vtbl->free)(doc->allocator,ptVar4);
      if (hasfpi == 0x3e) {
        lexer_00->lexsize = lexer_00->lexsize - 1;
        prvTidyUngetChar(0x3e,doc->docIn);
      }
      delim = 0;
    }
    break;
  case 3:
    if (hasfpi == local_30) {
      ptVar4 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)c,
                                 (lexer_00->lexsize - c) - 1);
      name = "SYSTEM";
      if (bVar6) {
        name = "PUBLIC";
      }
      pAVar5 = prvTidyAddAttribute(doc,(Node *)doc_local,name,ptVar4);
      (*doc->allocator->vtbl->free)(doc->allocator,ptVar4);
      pAVar5->delim = local_30;
      bVar6 = false;
      delim = 0;
      local_30 = no;
    }
    break;
  case 4:
    if (hasfpi == 0x5d) {
      lexer_00->txtstart = c;
      lexer_00->txtend = lexer_00->lexsize - 1;
      node_00 = prvTidyTextToken(lexer_00);
      prvTidyInsertNodeAtEnd((Node *)doc_local,node_00);
      delim = 0;
    }
  }
  goto switchD_00157d63_default;
}

Assistant:

static Node *ParseDocTypeDecl(TidyDocImpl* doc)
{
    Lexer *lexer = doc->lexer;
    int start = lexer->lexsize;
    ParseDocTypeDeclState state = DT_DOCTYPENAME;
    uint c;
    uint delim = 0;
    Bool hasfpi = yes;

    Node* node = TY_(NewNode)(lexer->allocator, lexer);
    node->type = DocTypeTag;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;

    lexer->waswhite = no;

    /* todo: reset lexer->lexsize when appropriate to avoid wasting memory */

    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream)
    {
        /* convert newlines to spaces */
        if (state != DT_INTSUBSET)
            c = c == '\n' ? ' ' : c;

        /* convert white-space sequences to single space character */
        if (TY_(IsWhite)(c) && state != DT_INTSUBSET)
        {
            if (!lexer->waswhite)
            {
                TY_(AddCharToLexer)(lexer, c);
                lexer->waswhite = yes;
            }
            else
            {
                /* discard space */
                continue;
            }
        }
        else
        {
            TY_(AddCharToLexer)(lexer, c);
            lexer->waswhite = no;
        }

        switch(state)
        {
        case DT_INTERMEDIATE:
            /* determine what's next */
            if (TY_(ToUpper)(c) == 'P' || TY_(ToUpper)(c) == 'S')
            {
                start = lexer->lexsize - 1;
                state = DT_PUBLICSYSTEM;
                continue;
            }
            else if (c == '[')
            {
                start = lexer->lexsize;
                state = DT_INTSUBSET;
                continue;
            }
            else if (c == '\'' || c == '"')
            {
                start = lexer->lexsize;
                delim = c;
                state = DT_QUOTEDSTRING;
                continue;
            }
            else if (c == '>')
            {
                AttVal* si;

                node->end = --(lexer->lexsize);

                si = TY_(GetAttrByName)(node, "SYSTEM");
                if (si)
                    TY_(CheckUrl)(doc, node, si);

                if (!node->element || !IsValidXMLElemName(node->element))
                {
                    TY_(Report)(doc, NULL, NULL, MALFORMED_DOCTYPE);
                    TY_(FreeNode)(doc, node);
                    return NULL;
                }
                return node;
            }
            else
            {
                /* error */
            }
            break;
        case DT_DOCTYPENAME:
            /* read document type name */
            if (TY_(IsWhite)(c) || c == '>' || c == '[')
            {
                node->element = TY_(tmbstrndup)(doc->allocator,
                                                lexer->lexbuf + start,
                                                lexer->lexsize - start - 1);
                if (c == '>' || c == '[')
                {
                    --(lexer->lexsize);
                    TY_(UngetChar)(c, doc->docIn);
                }

                state = DT_INTERMEDIATE;
                continue;
            }
            break;
        case DT_PUBLICSYSTEM:
            /* read PUBLIC/SYSTEM */
            if (TY_(IsWhite)(c) || c == '>')
            {
                char *attname = TY_(tmbstrndup)(doc->allocator,
                                                lexer->lexbuf + start,
                                                lexer->lexsize - start - 1);
                hasfpi = !(TY_(tmbstrcasecmp)(attname, "SYSTEM") == 0);

                TidyDocFree(doc, attname);

                /* todo: report an error if SYSTEM/PUBLIC not uppercase */

                if (c == '>')
                {
                    --(lexer->lexsize);
                    TY_(UngetChar)(c, doc->docIn);
                }

                state = DT_INTERMEDIATE;
                continue;
            }
            break;
        case DT_QUOTEDSTRING:
            /* read quoted string */
            if (c == delim)
            {
                char *value = TY_(tmbstrndup)(doc->allocator,
                                              lexer->lexbuf + start,
                                              lexer->lexsize - start - 1);
                AttVal* att = TY_(AddAttribute)(doc, node, hasfpi ? "PUBLIC" : "SYSTEM", value);
                TidyDocFree(doc, value);
                att->delim = delim;
                hasfpi = no;
                state = DT_INTERMEDIATE;
                delim = 0;
                continue;
            }
            break;
        case DT_INTSUBSET:
            /* read internal subset */
            if (c == ']')
            {
                Node* subset;
                lexer->txtstart = start;
                lexer->txtend = lexer->lexsize - 1;
                subset = TY_(TextToken)(lexer);
                TY_(InsertNodeAtEnd)(node, subset);
                state = DT_INTERMEDIATE;
            }
            break;
        }
    }

    /* document type declaration not finished */
    TY_(Report)(doc, NULL, NULL, MALFORMED_DOCTYPE);
    TY_(FreeNode)(doc, node);
    return NULL;
}